

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner.cc
# Opt level: O0

string * __thiscall
AwsCommandRunner::GetFullUrl(string *__return_storage_ptr__,AwsCommandRunner *this,string *path)

{
  string *psVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  size_t strip_length;
  string *path_local;
  AwsCommandRunner *this_local;
  
  strip_length = (size_t)path;
  path_local = (string *)this;
  this_local = (AwsCommandRunner *)__return_storage_ptr__;
  lVar4 = std::__cxx11::string::size();
  local_28 = (string *)(lVar4 + -1);
  iVar3 = std::__cxx11::string::compare(strip_length,0,local_28,(ulong)&this->local_path_,0);
  if (iVar3 != 0) {
    __assert_fail("path.compare(0, strip_length, local_path_, 0, strip_length) == 0 && \"Path does not start with the required prefix\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner.cc"
                  ,0x35,"std::string AwsCommandRunner::GetFullUrl(const std::string &)");
  }
  std::operator+(&local_48,"s3://",&this->s3_bucket_);
  sVar2 = strip_length;
  psVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,(string *)sVar2,(ulong)psVar1,&local_69);
  std::operator+(__return_storage_ptr__,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string AwsCommandRunner::GetFullUrl(const std::string& path) {
  std::size_t strip_length = local_path_.size() - 1;
  assert(path.compare(0, strip_length, local_path_, 0, strip_length) == 0 &&
         "Path does not start with the required prefix");
  return "s3://" + s3_bucket_ + std::string(path, strip_length);
}